

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseRenderingCase::init
          (BaseRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  ShaderProgram *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  RenderTarget *pRVar3;
  mapped_type *pmVar4;
  TestError *this_01;
  NotSupportedError *pNVar5;
  long *plVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  long lVar10;
  undefined1 auVar11 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  GLint maxSampleCount;
  StringTemplate fragmentSource;
  StringTemplate vertexSource;
  undefined1 local_2c0 [32];
  _Base_ptr local_2a0;
  size_t local_298;
  int local_28c;
  undefined1 local_288 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  ShaderProgram *local_260;
  undefined1 local_258 [16];
  char local_248 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string local_230;
  string local_210;
  undefined1 local_1f0 [8];
  pointer local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [6];
  ios_base local_178 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_160;
  undefined1 local_140 [208];
  string local_70;
  string local_50;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar3->m_width;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
    local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
    (**(code **)(lVar2 + 0x880))(0x8d41,this->m_fboInternalFormat,0x80a9,1,local_258);
    iVar1 = this->m_numRequestedSamples;
    local_28c = local_258._0_4_;
    if ((iVar1 != -2) && (local_28c = iVar1, (int)local_258._0_4_ < iVar1)) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>((string *)local_288,&this->m_numRequestedSamples);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                     "Test requires ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
      ;
      plVar6 = (long *)std::__cxx11::string::append(local_2c0);
      local_1f0 = (undefined1  [8])*plVar6;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if (local_1f0 == (undefined1  [8])paVar8) {
        local_1e0[0]._0_8_ = paVar8->_M_allocated_capacity;
        local_1e0[0]._8_8_ = plVar6[3];
        local_1f0 = (undefined1  [8])local_1e0;
      }
      else {
        local_1e0[0]._0_8_ = paVar8->_M_allocated_capacity;
      }
      local_1e8 = (pointer)plVar6[1];
      *plVar6 = (long)paVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1f0);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    local_28c = -1;
    if ((this->m_renderTarget == RENDERTARGET_DEFAULT) &&
       ((iVar1 < this->m_renderSize || (pRVar3->m_height < this->m_renderSize)))) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_258._0_8_ = local_248;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,"Render target size must be at least ","");
      de::toString<int>(&local_210,&this->m_renderSize);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                     &local_210);
      plVar6 = (long *)std::__cxx11::string::append(local_288);
      local_2c0._0_8_ = *plVar6;
      plVar7 = plVar6 + 2;
      if ((long *)local_2c0._0_8_ == plVar7) {
        local_2c0._16_8_ = *plVar7;
        local_2c0._24_8_ = plVar6[3];
        local_2c0._0_8_ = local_2c0 + 0x10;
      }
      else {
        local_2c0._16_8_ = *plVar7;
      }
      local_2c0._8_8_ = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      de::toString<int>(&local_230,&this->m_renderSize);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                     &local_230);
      tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1f0);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_1f0 = (undefined1  [8])local_1e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f0,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\n${INTERPOLATION}out highp vec4 v_color;\nuniform highp float u_pointSize;\nvoid main ()\n{\n\tgl_Position = a_position;\n\tgl_PointSize = u_pointSize;\n\tv_color = a_color;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_210,(string *)local_1f0);
  if (local_1f0 != (undefined1  [8])local_1e0) {
    operator_delete((void *)local_1f0,local_1e0[0]._M_allocated_capacity + 1);
  }
  local_1f0 = (undefined1  [8])local_1e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f0,
             "#version 300 es\nlayout(location = 0) out highp vec4 fragColor;\n${INTERPOLATION}in highp vec4 v_color;\nvoid main ()\n{\n\tfragColor = v_color;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_230,(string *)local_1f0);
  if (local_1f0 != (undefined1  [8])local_1e0) {
    operator_delete((void *)local_1f0,local_1e0[0]._M_allocated_capacity + 1);
  }
  local_2c0._24_8_ = local_2c0 + 8;
  local_2c0._8_8_ = (ulong)(uint)local_2c0._12_4_ << 0x20;
  local_2c0._16_8_ = (_Base_ptr)0x0;
  local_298 = 0;
  pcVar9 = "";
  if (this->m_flatshade != false) {
    pcVar9 = "flat ";
  }
  local_2a0 = (_Base_ptr)local_2c0._24_8_;
  local_1f0 = (undefined1  [8])local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"INTERPOLATION","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_2c0,(key_type *)local_1f0);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,(ulong)pcVar9);
  if (local_1f0 != (undefined1  [8])local_1e0) {
    operator_delete((void *)local_1f0,local_1e0[0]._M_allocated_capacity + 1);
  }
  local_260 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_140[0x10] = 0;
  local_140._17_8_ = 0;
  local_140._0_8_ = (pointer)0x0;
  local_140[8] = 0;
  local_140._9_7_ = 0;
  memset(local_1f0,0,0xac);
  tcu::StringTemplate::specialize
            (&local_50,(StringTemplate *)&local_210,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_2c0);
  local_288._0_8_ = (ulong)(uint)local_288._4_4_ << 0x20;
  local_288._8_8_ = &local_270;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_288 + 8),local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f0 + (local_288._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_288 + 8));
  tcu::StringTemplate::specialize
            (&local_70,(StringTemplate *)&local_230,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_2c0);
  local_258._0_4_ = 1;
  local_258._8_8_ = &local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_258 + 8),local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  this_00 = local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f0 + (local_258._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_258 + 8));
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_1f0);
  this->m_shader = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._8_8_ != &local_240) {
    operator_delete((void *)local_258._8_8_,local_240._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._8_8_ != &local_270) {
    operator_delete((void *)local_288._8_8_,local_270._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_140);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_160);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f0 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  if ((this->m_shader->m_program).m_info.linkOk != false) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_2c0);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_230);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_210);
    if (this->m_renderTarget != RENDERTARGET_DEFAULT) {
      (**(code **)(lVar2 + 0x6d0))(1,&this->m_fbo);
      (**(code **)(lVar2 + 0x78))(0x8d40,this->m_fbo);
      if (this->m_renderTarget - RENDERTARGET_RBO_SINGLESAMPLE < 2) {
        (**(code **)(lVar2 + 0x6e8))(1,&this->m_rbo);
        (**(code **)(lVar2 + 0xa0))(0x8d41,this->m_rbo);
        if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
          (**(code **)(lVar2 + 0x1240))
                    (0x8d41,local_28c,this->m_fboInternalFormat,this->m_renderSize,
                     this->m_renderSize);
        }
        else if (this->m_renderTarget == RENDERTARGET_RBO_SINGLESAMPLE) {
          (**(code **)(lVar2 + 0x1238))(0x8d41,this->m_fboInternalFormat,this->m_renderSize);
        }
        iVar1 = (**(code **)(lVar2 + 0x800))();
        if (iVar1 != 0) {
          if (iVar1 == 0x505) {
            pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            local_1f0 = (undefined1  [8])local_1e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f0,"could not create target texture, got out of memory","");
            tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1f0);
            __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          auVar11 = __cxa_allocate_exception(0x38);
          local_288._0_8_ = glu::getErrorName;
          local_288._8_4_ = iVar1;
          de::toString<tcu::Format::Enum<int,2ul>>
                    ((string *)local_2c0,(de *)local_288,auVar11._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0,"got ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c0);
          tcu::TestError::TestError(auVar11._0_8_,(string *)local_1f0);
          __cxa_throw(auVar11._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (**(code **)(lVar2 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_rbo);
      }
      else if (this->m_renderTarget == RENDERTARGET_TEXTURE_2D) {
        (**(code **)(lVar2 + 0x6f8))(1,&this->m_texture);
        (**(code **)(lVar2 + 0xb8))(0xde1,this->m_texture);
        (**(code **)(lVar2 + 0x1380))
                  (0xde1,1,this->m_fboInternalFormat,this->m_renderSize,this->m_renderSize);
        iVar1 = (**(code **)(lVar2 + 0x800))();
        if (iVar1 != 0) {
          if (iVar1 == 0x505) {
            pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            local_1f0 = (undefined1  [8])local_1e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f0,"could not create target texture, got out of memory","");
            tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1f0);
            __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          auVar11 = __cxa_allocate_exception(0x38);
          local_288._0_8_ = glu::getErrorName;
          local_288._8_4_ = iVar1;
          de::toString<tcu::Format::Enum<int,2ul>>
                    ((string *)local_2c0,(de *)local_288,auVar11._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0,"got ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c0);
          tcu::TestError::TestError(auVar11._0_8_,(string *)local_1f0);
          __cxa_throw(auVar11._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (**(code **)(lVar2 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_texture,0);
      }
    }
    if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
      (**(code **)(lVar2 + 0x6d0))(1,&this->m_blitDstFbo);
      (**(code **)(lVar2 + 0x78))(0x8d40,this->m_blitDstFbo);
      (**(code **)(lVar2 + 0x6e8))(1,&this->m_blitDstRbo);
      (**(code **)(lVar2 + 0xa0))(0x8d41,this->m_blitDstRbo);
      (**(code **)(lVar2 + 0x1238))(0x8d41,0x8058,this->m_renderSize);
      iVar1 = (**(code **)(lVar2 + 0x800))();
      if (iVar1 != 0) {
        if (iVar1 == 0x505) {
          pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          local_1f0 = (undefined1  [8])local_1e0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f0,"could not create blit target, got out of memory","");
          tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1f0);
          __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        auVar11 = __cxa_allocate_exception(0x38);
        local_288._0_8_ = glu::getErrorName;
        local_288._8_4_ = iVar1;
        de::toString<tcu::Format::Enum<int,2ul>>((string *)local_2c0,(de *)local_288,auVar11._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0,"got ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c0);
        tcu::TestError::TestError(auVar11._0_8_,(string *)local_1f0);
        __cxa_throw(auVar11._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar2 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_blitDstRbo);
      (**(code **)(lVar2 + 0x78))(0x8d40,this->m_fbo);
    }
    if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
      this->m_numSamples = -1;
      (**(code **)(lVar2 + 0xa0))(0x8d41,this->m_rbo);
      (**(code **)(lVar2 + 0xa30))(0x8d41,0x8cab,&this->m_numSamples);
      err = (**(code **)(lVar2 + 0x800))();
      glu::checkError(err,"get RENDERBUFFER_SAMPLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizationTests.cpp"
                      ,0x12d);
    }
    else if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
      pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
      this->m_numSamples = pRVar3->m_numSamples;
    }
    else {
      this->m_numSamples = 0;
    }
    (**(code **)(lVar2 + 0x868))(0xd50,&this->m_subpixelBits);
    local_1f0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"Sample count = ",0xf);
    std::ostream::operator<<((ostringstream *)&local_1e8,this->m_numSamples);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
    std::ios_base::~ios_base(local_178);
    local_1f0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"SUBPIXEL_BITS = ",0x10);
    std::ostream::operator<<((ostringstream *)&local_1e8,this->m_subpixelBits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
    iVar1 = std::ios_base::~ios_base(local_178);
    return iVar1;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  local_1f0 = (undefined1  [8])local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"could not create shader","");
  tcu::TestError::TestError(this_01,(string *)local_1f0);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BaseRenderingCase::init (void)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const int				width					= m_context.getRenderTarget().getWidth();
	const int				height					= m_context.getRenderTarget().getHeight();
	int						msaaTargetSamples		= -1;

	// Requirements

	if (m_renderTarget == RENDERTARGET_DEFAULT && (width < m_renderSize || height < m_renderSize))
		throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_renderSize) + "x" + de::toString(m_renderSize));

	if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		glw::GLint maxSampleCount = 0;
		gl.getInternalformativ(GL_RENDERBUFFER, m_fboInternalFormat, GL_SAMPLES, 1, &maxSampleCount);

		if (m_numRequestedSamples == SAMPLE_COUNT_MAX)
			msaaTargetSamples = maxSampleCount;
		else if (maxSampleCount >= m_numRequestedSamples)
			msaaTargetSamples = m_numRequestedSamples;
		else
			throw tcu::NotSupportedError("Test requires " + de::toString(m_numRequestedSamples) + "x msaa rbo");
	}

	// Gen shader

	{
		tcu::StringTemplate					vertexSource	(s_shaderVertexTemplate);
		tcu::StringTemplate					fragmentSource	(s_shaderFragmentTemplate);
		std::map<std::string, std::string>	params;

		params["INTERPOLATION"] = (m_flatshade) ? ("flat ") : ("");

		m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource.specialize(params)) << glu::FragmentSource(fragmentSource.specialize(params)));
		if (!m_shader->isOk())
			throw tcu::TestError("could not create shader");
	}

	// Fbo
	if (m_renderTarget != RENDERTARGET_DEFAULT)
	{
		glw::GLenum error;

		gl.genFramebuffers(1, &m_fbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);

		switch (m_renderTarget)
		{
			case RENDERTARGET_TEXTURE_2D:
			{
				gl.genTextures(1, &m_texture);
				gl.bindTexture(GL_TEXTURE_2D, m_texture);
				gl.texStorage2D(GL_TEXTURE_2D, 1, m_fboInternalFormat, m_renderSize, m_renderSize);

				error = gl.getError();
				if (error == GL_OUT_OF_MEMORY)
					throw tcu::NotSupportedError("could not create target texture, got out of memory");
				else if (error != GL_NO_ERROR)
					throw tcu::TestError("got " + de::toString(glu::getErrorStr(error)));

				gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
				break;
			}

			case RENDERTARGET_RBO_SINGLESAMPLE:
			case RENDERTARGET_RBO_MULTISAMPLE:
			{
				gl.genRenderbuffers(1, &m_rbo);
				gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo);

				if (m_renderTarget == RENDERTARGET_RBO_SINGLESAMPLE)
					gl.renderbufferStorage(GL_RENDERBUFFER, m_fboInternalFormat, m_renderSize, m_renderSize);
				else if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
					gl.renderbufferStorageMultisample(GL_RENDERBUFFER, msaaTargetSamples, m_fboInternalFormat, m_renderSize, m_renderSize);
				else
					DE_ASSERT(false);

				error = gl.getError();
				if (error == GL_OUT_OF_MEMORY)
					throw tcu::NotSupportedError("could not create target texture, got out of memory");
				else if (error != GL_NO_ERROR)
					throw tcu::TestError("got " + de::toString(glu::getErrorStr(error)));

				gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo);
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	// Resolve (blitFramebuffer) target fbo for MSAA targets
	if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		glw::GLenum error;

		gl.genFramebuffers(1, &m_blitDstFbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_blitDstFbo);

		gl.genRenderbuffers(1, &m_blitDstRbo);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_blitDstRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, m_renderSize, m_renderSize);

		error = gl.getError();
		if (error == GL_OUT_OF_MEMORY)
			throw tcu::NotSupportedError("could not create blit target, got out of memory");
		else if (error != GL_NO_ERROR)
			throw tcu::TestError("got " + de::toString(glu::getErrorStr(error)));

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_blitDstRbo);

		// restore state
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	}

	// Query info

	if (m_renderTarget == RENDERTARGET_DEFAULT)
		m_numSamples = m_context.getRenderTarget().getNumSamples();
	else if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		m_numSamples = -1;
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo);
		gl.getRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_SAMPLES, &m_numSamples);

		GLU_EXPECT_NO_ERROR(gl.getError(), "get RENDERBUFFER_SAMPLES");
	}
	else
		m_numSamples = 0;

	gl.getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);

	m_testCtx.getLog() << tcu::TestLog::Message << "Sample count = " << m_numSamples << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;
}